

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall delta_complex_t::print_complex(delta_complex_t *this,string *filename)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  reference this_00;
  int local_22c;
  int local_228;
  int j;
  int i;
  string local_218 [8];
  ofstream outstream;
  string *filename_local;
  delta_complex_t *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)filename);
  local_228 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
            ::size(&this->cells);
    if (sVar1 <= (ulong)(long)local_228) break;
    poVar2 = std::operator<<((ostream *)local_218,"Dim ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_22c = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ::operator[](&this->cells,(long)local_228);
      sVar1 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::size(pvVar3)
      ;
      if (sVar1 <= (ulong)(long)local_22c) break;
      pvVar3 = std::
               vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ::operator[](&this->cells,(long)local_228);
      this_00 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                          (pvVar3,(long)local_22c);
      delta_complex_cell_t::print_cell(this_00,(ofstream *)local_218);
      local_22c = local_22c + 1;
    }
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void print_complex(std::string filename){
        std::ofstream outstream;
        outstream.open(filename);
		for(int i = 0; i < cells.size(); i++){
			outstream << "Dim " << i << std::endl;
			for(int j = 0; j < cells[i].size(); j++){
				cells[i][j].print_cell(outstream);
			}
		}
        outstream.close();
	}